

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O3

void QDir::setSearchPaths(QString *prefix,QStringList *searchPaths)

{
  ushort uVar1;
  long lVar2;
  ulong uVar3;
  char16_t *pcVar4;
  bool bVar5;
  Type *this;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>_> *this_00;
  long lVar6;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (prefix->d).size;
  if (uVar3 < 2) {
    setSearchPaths();
  }
  else {
    pcVar4 = (prefix->d).ptr;
    lVar6 = 0;
    do {
      uVar1 = *(ushort *)((long)pcVar4 + lVar6);
      this_00 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>_>
                 *)(ulong)uVar1;
      if ((9 < uVar1 - 0x30) && (0x39 < uVar1 - 0x41 || 0xfffffff9 < uVar1 - 0x61)) {
        if (0x7f < uVar1) {
          bVar5 = QChar::isLetterOrNumber_helper((uint)uVar1);
          if (bVar5) goto LAB_0022621f;
        }
        setSearchPaths();
        goto LAB_0022626b;
      }
LAB_0022621f:
      lVar6 = lVar6 + 2;
    } while (uVar3 * 2 != lVar6);
    this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>_>::
           operator*(this_00);
    QReadWriteLock::lockForWrite(&this->mutex);
    if ((searchPaths->d).size == 0) {
      QHash<QString,_QList<QString>_>::removeImpl<QString>(&this->paths,prefix);
    }
    else {
      QHash<QString,QList<QString>>::emplace<QList<QString>const&>
                ((QHash<QString,QList<QString>> *)&this->paths,prefix,searchPaths);
    }
    QReadWriteLock::unlock(&this->mutex);
  }
LAB_0022626b:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDir::setSearchPaths(const QString &prefix, const QStringList &searchPaths)
{
    if (prefix.size() < 2) {
        qWarning("QDir::setSearchPaths: Prefix must be longer than 1 character");
        return;
    }

    for (QChar ch : prefix) {
        if (!ch.isLetterOrNumber()) {
            qWarning("QDir::setSearchPaths: Prefix can only contain letters or numbers");
            return;
        }
    }

    DirSearchPaths &conf = *dirSearchPaths;
    const QWriteLocker lock(&conf.mutex);
    if (searchPaths.isEmpty()) {
        conf.paths.remove(prefix);
    } else {
        conf.paths.insert(prefix, searchPaths);
    }
}